

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundles.c
# Opt level: O0

int Curl_bundle_remove_conn(connectbundle *cb_ptr,connectdata *conn)

{
  curl_llist_element *local_28;
  curl_llist_element *curr;
  connectdata *conn_local;
  connectbundle *cb_ptr_local;
  
  local_28 = cb_ptr->conn_list->head;
  while( true ) {
    if (local_28 == (curl_llist_element *)0x0) {
      return 0;
    }
    if ((connectdata *)local_28->ptr == conn) break;
    local_28 = local_28->next;
  }
  Curl_llist_remove(cb_ptr->conn_list,local_28,(void *)0x0);
  cb_ptr->num_connections = cb_ptr->num_connections - 1;
  conn->bundle = (connectbundle *)0x0;
  return 1;
}

Assistant:

int Curl_bundle_remove_conn(struct connectbundle *cb_ptr,
                            struct connectdata *conn)
{
  struct curl_llist_element *curr;

  curr = cb_ptr->conn_list->head;
  while(curr) {
    if(curr->ptr == conn) {
      Curl_llist_remove(cb_ptr->conn_list, curr, NULL);
      cb_ptr->num_connections--;
      conn->bundle = NULL;
      return 1; /* we removed a handle */
    }
    curr = curr->next;
  }
  return 0;
}